

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O2

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_mir
          (Inline_Func *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  Tag *pTVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  Function *pFVar7;
  Function *__x;
  Tag *tag;
  _Self __tmp_1;
  _Self __tmp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allInlinedFuncs;
  ostream local_19b;
  allocator<char> local_19a;
  allocator<char> local_199;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_198;
  MirPackage *local_190;
  _Rb_tree_node_base *local_188;
  undefined **local_180;
  undefined8 local_178;
  undefined1 local_170;
  string local_168;
  Function local_148;
  undefined1 local_f0 [32];
  Tag local_d0;
  undefined1 local_a0 [32];
  undefined1 local_80 [40];
  size_t local_58;
  string local_50;
  
  init(this,(EVP_PKEY_CTX *)package);
  local_198 = &package->functions;
  p_Var1 = &(package->functions)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
    optimize_func(this,&local_50,(MirFunction *)(p_Var3 + 2),local_198);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_80._24_8_ = local_80 + 8;
  local_80._8_4_ = _S_red;
  local_80._16_8_ = (_Base_ptr)0x0;
  local_58 = 0;
  local_80._32_8_ = local_80._24_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"main",(allocator<char> *)(local_f0 + 0x20));
  this_00 = &this->uninlined_funcs;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"f__main",(allocator<char> *)(local_f0 + 0x20));
  pFVar7 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar7)
  ;
  std::__cxx11::string::~string((string *)&local_148);
  local_190 = package;
  for (p_Var3 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (*(char *)&p_Var3[3]._M_parent[1]._M_left == '\0') {
      __x = (Function *)(p_Var3 + 1);
      pFVar7 = __x;
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(this_00,(key_type *)__x);
      if (sVar4 == 0) {
        pFVar7 = __x;
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->uninlineable_funcs,(key_type *)__x);
        if (sVar4 == 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
          pFVar7 = __x;
        }
      }
    }
  }
  pTVar2 = (Tag *)(local_f0 + 0x20);
  p_Var6 = (_Rb_tree_node_base *)local_80._24_8_;
  local_188 = &p_Var1->_M_header;
  for (; p_Var6 != (_Rb_tree_node_base *)(local_80 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    tag = (Tag *)(p_Var6 + 1);
    std::__cxx11::string::string((string *)local_a0,(string *)tag);
    local_19b = (ostream)0x0;
    AixLog::operator<<(&local_19b,(Severity *)tag);
    AixLog::Tag::Tag(pTVar2);
    AixLog::operator<<((ostream *)pTVar2,tag);
    local_178 = std::chrono::_V2::system_clock::now();
    local_180 = &PTR__Timestamp_001d8f28;
    local_170 = 0;
    AixLog::operator<<((ostream *)&local_180,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"optimize_mir",&local_19a)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
               ,&local_199);
    pFVar7 = (Function *)local_f0;
    AixLog::Function::Function(&local_148,(string *)local_f0,&local_168,0x19f);
    AixLog::operator<<((ostream *)&local_148,pFVar7);
    poVar5 = std::operator<<((ostream *)&std::clog,(string *)local_a0);
    poVar5 = std::operator<<(poVar5," is deleted because all of it\'s calls are inlined ");
    std::endl<char,std::char_traits<char>>(poVar5);
    AixLog::Function::~Function(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_f0);
    AixLog::Tag::~Tag(pTVar2);
    pFVar7 = (Function *)local_a0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
    ::erase(&local_198->_M_t,(key_type *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  pTVar2 = (Tag *)(local_f0 + 0x20);
  for (p_Var3 = (local_190->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 != local_188; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_180 = (undefined **)((ulong)local_180 & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&local_180,(Severity *)pFVar7);
    AixLog::Tag::Tag(pTVar2);
    AixLog::operator<<((ostream *)pTVar2,(Tag *)pFVar7);
    local_168._M_string_length = std::chrono::_V2::system_clock::now();
    local_168._M_dataplus._M_p = (pointer)&PTR__Timestamp_001d8f28;
    local_168.field_2._M_local_buf[0] = '\0';
    AixLog::operator<<((ostream *)&local_168,(Timestamp *)pFVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"optimize_mir",(allocator<char> *)&local_19b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
               ,&local_19a);
    pFVar7 = (Function *)local_a0;
    AixLog::Function::Function(&local_148,(string *)local_a0,(string *)local_f0,0x1a5);
    AixLog::operator<<((ostream *)&local_148,pFVar7);
    poVar5 = std::operator<<((ostream *)&std::clog,(string *)&p_Var3[2]._M_parent);
    poVar5 = std::operator<<(poVar5," variables size is ");
    pFVar7 = *(Function **)(p_Var3 + 5);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    AixLog::Function::~Function(&local_148);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_a0);
    AixLog::Tag::~Tag(pTVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    init(package);
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      optimize_func(iter->first, iter->second, package.functions);
    }
    std::set<std::string> allInlinedFuncs;
    uninlined_funcs.insert("main");
    uninlined_funcs.insert("f__main");
    for (auto& pair : package.functions) {
      if (pair.second.type->is_extern) continue;
      if (!uninlined_funcs.count(pair.first) &&
          !uninlineable_funcs.count(pair.first)) {
        allInlinedFuncs.insert(pair.first);
      }
    }
    for (auto s : allInlinedFuncs) {
      LOG(TRACE) << s << " is deleted because all of it's calls are inlined "
                 << std::endl;
      package.functions.erase(s);
    }
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      LOG(TRACE) << iter->second.name << " variables size is "
                 << iter->second.variables.size() << std::endl;
    }
  }